

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::ParseGoogleTestFlagsOnly(int *argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char **in_RDX;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char **extraout_RDX_04;
  char **extraout_RDX_05;
  char **extraout_RDX_06;
  long lVar3;
  _Alloc_hider _Var4;
  int iVar5;
  string sStack_50;
  
  _Var4._M_p = (pointer)argc;
  if (1 < *argc) {
    iVar5 = 1;
    do {
      StreamableToString<char*>(&sStack_50,(internal *)(argv + iVar5),in_RDX);
      _Var4._M_p = sStack_50._M_dataplus._M_p;
      bVar1 = ParseGoogleTestFlag(sStack_50._M_dataplus._M_p);
      in_RDX = extraout_RDX;
      if (bVar1) {
LAB_0038f563:
        iVar2 = *argc;
        if (iVar2 != iVar5) {
          in_RDX = argv + (long)iVar5 + 1;
          lVar3 = 0;
          do {
            in_RDX[lVar3 + -1] = in_RDX[lVar3];
            lVar3 = lVar3 + 1;
          } while (iVar2 - iVar5 != (int)lVar3);
        }
        *argc = iVar2 + -1;
        iVar5 = iVar5 + -1;
      }
      else {
        bVar1 = ParseStringFlag<std::__cxx11::string>
                          (_Var4._M_p,"flagfile",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &FLAGS_gtest_flagfile_abi_cxx11_);
        if (bVar1) {
          LoadFlagsFromFile((string *)_Var4._M_p);
          in_RDX = extraout_RDX_00;
          goto LAB_0038f563;
        }
        iVar2 = std::__cxx11::string::compare((char *)&sStack_50);
        in_RDX = extraout_RDX_01;
        if (iVar2 == 0) {
LAB_0038f5e9:
          g_help_flag = '\x01';
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&sStack_50);
          in_RDX = extraout_RDX_02;
          if (iVar2 == 0) goto LAB_0038f5e9;
          iVar2 = std::__cxx11::string::compare((char *)&sStack_50);
          in_RDX = extraout_RDX_03;
          if (iVar2 == 0) goto LAB_0038f5e9;
          iVar2 = std::__cxx11::string::compare((char *)&sStack_50);
          in_RDX = extraout_RDX_04;
          if (iVar2 == 0) goto LAB_0038f5e9;
          bVar1 = HasGoogleTestFlagPrefix((char *)0x38f5e5);
          in_RDX = extraout_RDX_05;
          if (bVar1) goto LAB_0038f5e9;
        }
      }
      _Var4._M_p = sStack_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_50._M_dataplus._M_p != &sStack_50.field_2) {
        operator_delete(sStack_50._M_dataplus._M_p,sStack_50.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_06;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < *argc);
  }
  if (g_help_flag != '\0') {
    PrintColorEncoded(_Var4._M_p);
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnly(int* argc, char** argv) {
  ParseGoogleTestFlagsOnlyImpl(argc, argv);

  // Fix the value of *_NSGetArgc() on macOS, but iff
  // *_NSGetArgv() == argv
  // Only applicable to char** version of argv
#if GTEST_OS_MAC
#ifndef GTEST_OS_IOS
  if (*_NSGetArgv() == argv) {
    *_NSGetArgc() = *argc;
  }
#endif
#endif
}